

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddImageRounded
          (ImDrawList *this,ImTextureID user_texture_id,ImVec2 *p_min,ImVec2 *p_max,ImVec2 *uv_min,
          ImVec2 *uv_max,ImU32 col,float rounding,ImDrawFlags flags)

{
  int vert_start_idx_00;
  uint flags_00;
  bool bVar1;
  int vert_end_idx;
  int vert_start_idx;
  bool push_texture_id;
  float rounding_local;
  ImVec2 *uv_max_local;
  ImVec2 *uv_min_local;
  ImVec2 *p_max_local;
  ImVec2 *p_min_local;
  ImTextureID user_texture_id_local;
  ImDrawList *this_local;
  
  if ((col & 0xff000000) != 0) {
    flags_00 = FixRectCornerFlags(flags);
    if ((rounding <= 0.0) || ((flags_00 & 0x1f0) == 0x100)) {
      AddImage(this,user_texture_id,p_min,p_max,uv_min,uv_max,col);
    }
    else {
      bVar1 = user_texture_id != (this->_CmdHeader).TextureId;
      if (bVar1) {
        PushTextureID(this,user_texture_id);
      }
      vert_start_idx_00 = (this->VtxBuffer).Size;
      PathRect(this,p_min,p_max,rounding,flags_00);
      PathFillConvex(this,col);
      ImGui::ShadeVertsLinearUV
                (this,vert_start_idx_00,(this->VtxBuffer).Size,p_min,p_max,uv_min,uv_max,true);
      if (bVar1) {
        PopTextureID(this);
      }
    }
  }
  return;
}

Assistant:

void ImDrawList::AddImageRounded(ImTextureID user_texture_id, const ImVec2& p_min, const ImVec2& p_max, const ImVec2& uv_min, const ImVec2& uv_max, ImU32 col, float rounding, ImDrawFlags flags)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    flags = FixRectCornerFlags(flags);
    if (rounding <= 0.0f || (flags & ImDrawFlags_RoundCornersMask_) == ImDrawFlags_RoundCornersNone)
    {
        AddImage(user_texture_id, p_min, p_max, uv_min, uv_max, col);
        return;
    }

    const bool push_texture_id = user_texture_id != _CmdHeader.TextureId;
    if (push_texture_id)
        PushTextureID(user_texture_id);

    int vert_start_idx = VtxBuffer.Size;
    PathRect(p_min, p_max, rounding, flags);
    PathFillConvex(col);
    int vert_end_idx = VtxBuffer.Size;
    ImGui::ShadeVertsLinearUV(this, vert_start_idx, vert_end_idx, p_min, p_max, uv_min, uv_max, true);

    if (push_texture_id)
        PopTextureID();
}